

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaNormLen(xmlChar *value)

{
  bool bVar1;
  int local_24;
  byte *pbStack_20;
  int ret;
  xmlChar *utf;
  xmlChar *value_local;
  
  local_24 = 0;
  pbStack_20 = value;
  if (value == (xmlChar *)0x0) {
    value_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar1 = true;
      if ((*pbStack_20 != 0x20) && ((*pbStack_20 < 9 || (bVar1 = true, 10 < *pbStack_20)))) {
        bVar1 = *pbStack_20 == 0xd;
      }
      if (!bVar1) break;
      pbStack_20 = pbStack_20 + 1;
    }
    while (*pbStack_20 != 0) {
      if ((*pbStack_20 & 0x80) == 0) {
        if ((*pbStack_20 == 0x20) ||
           (((8 < *pbStack_20 && (*pbStack_20 < 0xb)) || (*pbStack_20 == 0xd)))) {
          while( true ) {
            bVar1 = true;
            if ((*pbStack_20 != 0x20) && ((*pbStack_20 < 9 || (bVar1 = true, 10 < *pbStack_20)))) {
              bVar1 = *pbStack_20 == 0xd;
            }
            if (!bVar1) break;
            pbStack_20 = pbStack_20 + 1;
          }
          if (*pbStack_20 == 0) break;
        }
        else {
          pbStack_20 = pbStack_20 + 1;
        }
      }
      else {
        if ((pbStack_20[1] & 0xc0) != 0x80) {
          return -1;
        }
        if ((*pbStack_20 & 0xe0) == 0xe0) {
          if ((pbStack_20[2] & 0xc0) != 0x80) {
            return -1;
          }
          if ((*pbStack_20 & 0xf0) == 0xf0) {
            if (((*pbStack_20 & 0xf8) != 0xf0) || ((pbStack_20[3] & 0xc0) != 0x80)) {
              return -1;
            }
            pbStack_20 = pbStack_20 + 4;
          }
          else {
            pbStack_20 = pbStack_20 + 3;
          }
        }
        else {
          pbStack_20 = pbStack_20 + 2;
        }
      }
      local_24 = local_24 + 1;
    }
    value_local._4_4_ = local_24;
  }
  return value_local._4_4_;
}

Assistant:

static int
xmlSchemaNormLen(const xmlChar *value) {
    const xmlChar *utf;
    int ret = 0;

    if (value == NULL)
	return(-1);
    utf = value;
    while (IS_BLANK_CH(*utf)) utf++;
    while (*utf != 0) {
	if (utf[0] & 0x80) {
	    if ((utf[1] & 0xc0) != 0x80)
		return(-1);
	    if ((utf[0] & 0xe0) == 0xe0) {
		if ((utf[2] & 0xc0) != 0x80)
		    return(-1);
		if ((utf[0] & 0xf0) == 0xf0) {
		    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
			return(-1);
		    utf += 4;
		} else {
		    utf += 3;
		}
	    } else {
		utf += 2;
	    }
	} else if (IS_BLANK_CH(*utf)) {
	    while (IS_BLANK_CH(*utf)) utf++;
	    if (*utf == 0)
		break;
	} else {
	    utf++;
	}
	ret++;
    }
    return(ret);
}